

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
Hpipe::Vec<std::__cxx11::string>::push_back_unique<char_const(&)[73]>
          (Vec<std::__cxx11::string> *this,char (*val) [73])

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  uint uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_R15;
  bool bVar4;
  
  bVar4 = *(char **)(this + 8) != *(char **)this;
  if (bVar4) {
    iVar1 = std::__cxx11::string::compare(*(char **)this);
    if (iVar1 == 0) {
      unaff_R15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    else {
      uVar3 = 1;
      do {
        unaff_R15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (ulong)uVar3;
        pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (*(long *)(this + 8) - *(long *)this >> 5);
        bVar4 = unaff_R15 < pbVar2;
        if (pbVar2 <= unaff_R15) goto LAB_001569db;
        iVar1 = std::__cxx11::string::compare((char *)(*(long *)this + (long)unaff_R15 * 0x20));
        uVar3 = uVar3 + 1;
      } while (iVar1 != 0);
    }
    unaff_R15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)unaff_R15 * 0x20 + *(long *)this);
  }
LAB_001569db:
  if (!bVar4) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[73]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,val);
    unaff_R15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (*(long *)(this + 8) + -0x20);
  }
  return unaff_R15;
}

Assistant:

T       *push_back_unique     ( Arg &&val ) { for( unsigned i = 0; i < this->size(); ++i ) if ( this->operator[]( i ) == val ) return &this->operator[]( i ); return push_back( std::forward<Arg>( val ) ); }